

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_shared_code_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::SharedCodeGenerator::Generate
          (SharedCodeGenerator *this,GeneratorContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *file_list,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *annotation_file_list)

{
  bool bVar1;
  int iVar2;
  pointer this_00;
  undefined4 extraout_var;
  Printer *this_01;
  pointer pZVar3;
  pointer pPVar4;
  string *psVar5;
  ulong uVar6;
  undefined4 extraout_var_00;
  unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
  *local_1f0;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  local_1b8;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  info_output;
  string local_1a8;
  undefined1 local_188 [8];
  string info_full_path;
  string info_relative_path;
  unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
  printer;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  GeneratedCodeInfo annotations;
  unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
  output;
  undefined1 local_d8 [8];
  string filename;
  string classname;
  string local_88;
  undefined1 local_68 [8];
  string package_dir;
  string java_package;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *annotation_file_list_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *file_list_local;
  GeneratorContext *context_local;
  SharedCodeGenerator *this_local;
  
  FileJavaPackage_abi_cxx11_
            ((string *)(package_dir.field_2._M_local_buf + 8),(java *)this->file_,
             (FileDescriptor *)file_list);
  std::__cxx11::string::string((string *)&local_88,(string *)(package_dir.field_2._M_local_buf + 8))
  ;
  JavaPackageToDir((string *)local_68,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = HasDescriptorMethods(this->file_,(bool)((this->options_).enforce_lite & 1));
  if (bVar1) {
    this_00 = std::
              unique_ptr<google::protobuf::compiler::java::ClassNameResolver,_std::default_delete<google::protobuf::compiler::java::ClassNameResolver>_>
              ::operator->(&this->name_resolver_);
    ClassNameResolver::GetDescriptorClassName_abi_cxx11_
              ((string *)((long)&filename.field_2 + 8),this_00,this->file_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                   ".java");
    std::__cxx11::string::~string((string *)&output);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(file_list,(value_type *)local_d8);
    iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_d8);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
    ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
              ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                *)&annotations._cached_size_,(pointer)CONCAT44(extraout_var,iVar2));
    GeneratedCodeInfo::GeneratedCodeInfo
              ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AnnotationProtoCollector
              ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&printer,
               (GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    this_01 = (Printer *)operator_new(0xa0);
    pZVar3 = std::
             unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             ::get((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                    *)&annotations._cached_size_);
    if (((this->options_).annotate_code & 1U) == 0) {
      local_1f0 = (unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                   *)0x0;
    }
    else {
      local_1f0 = &printer;
    }
    io::Printer::Printer(this_01,pZVar3,'$',(AnnotationCollector *)local_1f0);
    std::
    unique_ptr<google::protobuf::io::Printer,std::default_delete<google::protobuf::io::Printer>>::
    unique_ptr<std::default_delete<google::protobuf::io::Printer>,void>
              ((unique_ptr<google::protobuf::io::Printer,std::default_delete<google::protobuf::io::Printer>>
                *)(info_relative_path.field_2._M_local_buf + 8),this_01);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&info_full_path.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&filename.field_2 + 8),".java.pb.meta");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   ".pb.meta");
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
    io::Printer::Print<char[9],std::__cxx11::string>
              (pPVar4,
               "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n// source: $filename$\n\n"
               ,(char (*) [9])"filename",psVar5);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      pPVar4 = std::
               unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
               ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                             *)((long)&info_relative_path.field_2 + 8));
      io::Printer::Print<char[8],std::__cxx11::string>
                (pPVar4,"package $package$;\n\n",(char (*) [8])0x7cbbda,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&package_dir.field_2 + 8));
    }
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::get((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                    *)((long)&info_relative_path.field_2 + 8));
    info_output._M_t.
    super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ._M_t.
    super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl._6_1_ =
         0;
    if (((this->options_).annotate_code & 1U) == 0) {
      std::allocator<char>::allocator();
      info_output._M_t.
      super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl._6_1_
           = 1;
      std::__cxx11::string::string
                ((string *)&local_1a8,"",
                 (allocator *)
                 ((long)&info_output._M_t.
                         super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                         ._M_head_impl + 7));
    }
    else {
      std::__cxx11::string::string
                ((string *)&local_1a8,(string *)(info_full_path.field_2._M_local_buf + 8));
    }
    PrintGeneratedAnnotation(pPVar4,'$',&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    if ((info_output._M_t.
         super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
         .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>._M_head_impl.
         _6_1_ & 1) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&info_output._M_t.
                         super___uniq_ptr_impl<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                         .super__Head_base<0UL,_google::protobuf::io::ZeroCopyOutputStream_*,_false>
                         ._M_head_impl + 7));
    }
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    io::Printer::Print<char[10],std::__cxx11::string>
              (pPVar4,
               "public final class $classname$ {\n  public static com.google.protobuf.Descriptors.FileDescriptor\n      descriptor;\n  static {\n"
               ,(char (*) [10])0x77c586,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&filename.field_2 + 8));
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
    io::Printer::Annotate(pPVar4,"classname",psVar5);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    io::Printer::Indent(pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    io::Printer::Indent(pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::get((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                    *)((long)&info_relative_path.field_2 + 8));
    GenerateDescriptors(this,pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    io::Printer::Outdent(pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    io::Printer::Outdent(pPVar4);
    pPVar4 = std::
             unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
             ::operator->((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                           *)((long)&info_relative_path.field_2 + 8));
    io::Printer::Print<>(pPVar4,"  }\n}\n");
    if (((this->options_).annotate_code & 1U) != 0) {
      iVar2 = (*context->_vptr_GeneratorContext[2])(context,local_188);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
      ::unique_ptr<std::default_delete<google::protobuf::io::ZeroCopyOutputStream>,void>
                ((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,std::default_delete<google::protobuf::io::ZeroCopyOutputStream>>
                  *)&local_1b8,(pointer)CONCAT44(extraout_var_00,iVar2));
      pZVar3 = std::
               unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
               ::get(&local_1b8);
      MessageLite::SerializeToZeroCopyStream
                ((MessageLite *)&annotation_collector.annotation_proto_,pZVar3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(annotation_file_list,(value_type *)local_188);
      std::
      unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
      ::~unique_ptr(&local_1b8);
    }
    std::
    unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>::
    reset((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
           *)((long)&info_relative_path.field_2 + 8),(pointer)0x0);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::reset((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
             *)&annotations._cached_size_,(pointer)0x0);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)(info_full_path.field_2._M_local_buf + 8));
    std::
    unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>::
    ~unique_ptr((unique_ptr<google::protobuf::io::Printer,_std::default_delete<google::protobuf::io::Printer>_>
                 *)((long)&info_relative_path.field_2 + 8));
    io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::~AnnotationProtoCollector
              ((AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)&printer);
    GeneratedCodeInfo::~GeneratedCodeInfo
              ((GeneratedCodeInfo *)&annotation_collector.annotation_proto_);
    std::
    unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
    ::~unique_ptr((unique_ptr<google::protobuf::io::ZeroCopyOutputStream,_std::default_delete<google::protobuf::io::ZeroCopyOutputStream>_>
                   *)&annotations._cached_size_);
    std::__cxx11::string::~string((string *)local_d8);
    std::__cxx11::string::~string((string *)(filename.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(package_dir.field_2._M_local_buf + 8));
  return;
}

Assistant:

void SharedCodeGenerator::Generate(
    GeneratorContext* context, std::vector<std::string>* file_list,
    std::vector<std::string>* annotation_file_list) {
  std::string java_package = FileJavaPackage(file_);
  std::string package_dir = JavaPackageToDir(java_package);

  if (HasDescriptorMethods(file_, options_.enforce_lite)) {
    // Generate descriptors.
    std::string classname = name_resolver_->GetDescriptorClassName(file_);
    std::string filename = package_dir + classname + ".java";
    file_list->push_back(filename);
    std::unique_ptr<io::ZeroCopyOutputStream> output(context->Open(filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    std::unique_ptr<io::Printer> printer(
        new io::Printer(output.get(), '$',
                        options_.annotate_code ? &annotation_collector : NULL));
    std::string info_relative_path = classname + ".java.pb.meta";
    std::string info_full_path = filename + ".pb.meta";
    printer->Print(
        "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
        "// source: $filename$\n"
        "\n",
        "filename", file_->name());
    if (!java_package.empty()) {
      printer->Print(
          "package $package$;\n"
          "\n",
          "package", java_package);
    }
    PrintGeneratedAnnotation(printer.get(), '$',
                             options_.annotate_code ? info_relative_path : "");
    printer->Print(
        "public final class $classname$ {\n"
        "  public static com.google.protobuf.Descriptors.FileDescriptor\n"
        "      descriptor;\n"
        "  static {\n",
        "classname", classname);
    printer->Annotate("classname", file_->name());
    printer->Indent();
    printer->Indent();
    GenerateDescriptors(printer.get());
    printer->Outdent();
    printer->Outdent();
    printer->Print(
        "  }\n"
        "}\n");

    if (options_.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
      annotation_file_list->push_back(info_full_path);
    }

    printer.reset();
    output.reset();
  }
}